

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rr_cache.hpp
# Opt level: O0

void __thiscall
cappuccino::
rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::rr_cache(rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
           *this,size_t capacity,float max_load_factor)

{
  size_type sVar1;
  result_type rVar2;
  iterator __first;
  iterator __last;
  allocator<unsigned_long> local_2d [16];
  allocator<cappuccino::rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>
  local_1d;
  float local_1c;
  size_t sStack_18;
  float max_load_factor_local;
  size_t capacity_local;
  rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  *this_local;
  
  local_1c = max_load_factor;
  sStack_18 = capacity;
  capacity_local = (size_t)this;
  mutex<(cappuccino::thread_safe)1,_std::mutex>::mutex(&this->m_lock);
  sVar1 = sStack_18;
  std::
  allocator<cappuccino::rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>
  ::allocator(&local_1d);
  std::
  vector<cappuccino::rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
  ::vector(&this->m_elements,sVar1,&local_1d);
  std::
  allocator<cappuccino::rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>
  ::~allocator(&local_1d);
  std::
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::unordered_map(&this->m_keyed_elements);
  sVar1 = sStack_18;
  std::allocator<unsigned_long>::allocator(local_2d);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->m_open_list,sVar1,local_2d);
  std::allocator<unsigned_long>::~allocator(local_2d);
  this->m_open_list_end = 0;
  std::random_device::random_device(&this->m_random_device);
  rVar2 = std::random_device::operator()(&this->m_random_device);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(&this->m_mt,(ulong)rVar2);
  __first = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->m_open_list);
  __last = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(&this->m_open_list);
  std::
  iota<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,int>
            ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )__first._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )__last._M_current,0);
  std::
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::max_load_factor(&this->m_keyed_elements,local_1c);
  std::
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::reserve(&this->m_keyed_elements,sStack_18);
  return;
}

Assistant:

explicit rr_cache(size_t capacity, float max_load_factor = 1.0f)
        : m_elements(capacity),
          m_open_list(capacity),
          m_random_device(),
          m_mt(m_random_device())
    {
        std::iota(m_open_list.begin(), m_open_list.end(), 0);

        m_keyed_elements.max_load_factor(max_load_factor);
        m_keyed_elements.reserve(capacity);
    }